

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void __thiscall TCMallocImplementation::MarkThreadBusy(TCMallocImplementation *this)

{
  void *pvVar1;
  Span *span;
  bool bVar2;
  int iVar3;
  undefined8 *in_RAX;
  ThreadCache *pTVar4;
  ulong uVar5;
  ulong uVar6;
  _func_void_void_ptr *invalid_free_fn;
  uint uVar7;
  undefined8 *in_FS_OFFSET;
  ThreadCachePtr TVar8;
  undefined8 *local_28;
  void *rv;
  
  local_28 = in_RAX;
  TVar8 = tcmalloc::ThreadCachePtr::Grab();
  pTVar4 = TVar8.ptr_;
  uVar7 = (uint)tcmalloc::Static::sizemap_;
  iVar3 = pTVar4->list_[tcmalloc::Static::sizemap_].size_;
  bVar2 = tcmalloc::ThreadCache::FreeList::TryPop
                    (pTVar4->list_ + tcmalloc::Static::sizemap_,&local_28);
  if (bVar2) {
    pTVar4->size_ = pTVar4->size_ - iVar3;
  }
  else {
    local_28 = (undefined8 *)
               tcmalloc::ThreadCache::FetchFromCentralCache
                         (pTVar4,uVar7,iVar3,anon_unknown.dwarf_4f4a::nop_oom_handler);
  }
  pTVar4 = (ThreadCache *)*in_FS_OFFSET;
  uVar5 = (ulong)local_28 >> 0xd;
  invalid_free_fn = (_func_void_void_ptr *)(uVar5 & 0xffff);
  uVar6 = *(ulong *)(tcmalloc::Static::pageheap_ + (long)invalid_free_fn * 8 + 0x10) ^
          uVar5 & 0xffffffffffff0000;
  if (0x7f < uVar6) {
    if ((((ulong)local_28 >> 0x30 != 0) ||
        (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)local_28 >> 0x1f) * 8 + 0x80010) == 0)) ||
       (span = *(Span **)(*(long *)(tcmalloc::Static::pageheap_ +
                                   ((ulong)local_28 >> 0x1f) * 8 + 0x80010) +
                         (ulong)((uint)uVar5 & 0x3ffff) * 8), span == (Span *)0x0))
    goto LAB_00110f7e;
    uVar6 = (ulong)(byte)span->field_0x2a;
    if (uVar6 == 0) {
      anon_unknown.dwarf_4f4a::do_free_pages(span,local_28);
      return;
    }
    *(ulong *)(tcmalloc::Static::pageheap_ + (long)invalid_free_fn * 8 + 0x10) =
         uVar5 & 0xffffffffffff0000 | uVar6;
  }
  if (pTVar4 != (ThreadCache *)0x0) {
    uVar5 = uVar6 & 0xffffffff;
    uVar7 = pTVar4->list_[uVar5].length_ + 1;
    pvVar1 = pTVar4->list_[uVar5].list_;
    pTVar4->list_[uVar5].list_ = local_28;
    *local_28 = pvVar1;
    pTVar4->list_[uVar5].length_ = uVar7;
    if (pTVar4->list_[uVar5].max_length_ < uVar7) {
      tcmalloc::ThreadCache::ListTooLong(pTVar4,pTVar4->list_ + uVar5,(uint32_t)uVar6);
      return;
    }
    iVar3 = pTVar4->size_ + pTVar4->list_[uVar5].size_;
    pTVar4->size_ = iVar3;
    if (iVar3 <= pTVar4->max_size_) {
      return;
    }
    tcmalloc::ThreadCache::Scavenge(pTVar4);
    return;
  }
  if (tcmalloc::Static::inited_ != '\0') {
    *local_28 = 0;
    tcmalloc::CentralFreeList::InsertRange
              ((CentralFreeList *)(tcmalloc::Static::central_cache_ + (uVar6 & 0xffffffff) * 0x4c0),
               local_28,local_28,1);
    return;
  }
LAB_00110f7e:
  anon_unknown.dwarf_4f4a::free_null_or_invalid(local_28,invalid_free_fn);
  return;
}

Assistant:

void TCMallocImplementation::MarkThreadBusy() {
  // Allocate to force the creation of a thread cache, but avoid
  // invoking any hooks.
  do_free(do_malloc(0));
}